

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ptls_openssl_decrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  ptls_buffer_t *ppVar1;
  int iVar2;
  int iVar3;
  EVP_CIPHER_CTX *ctx;
  HMAC_CTX *ctx_00;
  size_t sVar4;
  ulong uVar5;
  uchar *data;
  size_t len;
  int clen;
  ptls_buffer_t *local_80;
  uint8_t hmac [64];
  
  uVar5 = src.len;
  data = src.base;
  ctx = EVP_CIPHER_CTX_new();
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    return 0x201;
  }
  ctx_00 = (HMAC_CTX *)HMAC_CTX_new();
  if (ctx_00 == (HMAC_CTX *)0x0) {
    iVar3 = 0x201;
  }
  else {
    iVar3 = 0x32;
    local_80 = buf;
    if (0x1f < uVar5) {
      iVar2 = (*cb)(data,data + 0x10,(EVP_CIPHER_CTX *)ctx,(HMAC_CTX *)ctx_00,0);
      if (iVar2 != 0) {
        sVar4 = HMAC_size(ctx_00);
        if (uVar5 < sVar4 + 0x20) goto LAB_00121fe2;
        len = uVar5 - sVar4;
        iVar3 = HMAC_Update(ctx_00,data,len);
        if ((iVar3 != 0) && (iVar3 = HMAC_Final(ctx_00,hmac,(uint *)0x0), iVar3 != 0)) {
          iVar3 = (*ptls_mem_equal)(data + len,hmac,sVar4);
          if (iVar3 == 0) {
            iVar3 = 0x28;
            goto LAB_00121fe2;
          }
          iVar3 = ptls_buffer_reserve(local_80,len - 0x20);
          ppVar1 = local_80;
          if (iVar3 != 0) goto LAB_00121fe2;
          iVar3 = EVP_DecryptUpdate(ctx,local_80->base + local_80->off,&clen,data + 0x20,
                                    (int)(len - 0x20));
          if (iVar3 != 0) {
            sVar4 = (long)clen + ppVar1->off;
            ppVar1->off = sVar4;
            iVar2 = EVP_DecryptFinal_ex(ctx,ppVar1->base + sVar4,&clen);
            iVar3 = 0x203;
            if (iVar2 != 0) {
              local_80->off = local_80->off + (long)clen;
              iVar3 = 0;
            }
            goto LAB_00121fe2;
          }
        }
      }
      iVar3 = 0x203;
    }
  }
LAB_00121fe2:
  cleanup_cipher_ctx((EVP_CIPHER_CTX *)ctx);
  if (ctx_00 != (HMAC_CTX *)0x0) {
    HMAC_CTX_free(ctx_00);
  }
  return iVar3;
}

Assistant:

int ptls_openssl_decrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* obtain cipher and hash context.
     * Note: no need to handle renew, since in picotls we always send a new ticket to minimize the chance of ticket reuse */
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if (!(*cb)(src.base, src.base + TICKET_LABEL_SIZE, cctx, hctx, 0)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* check hmac, and exclude label, iv, hmac */
    size_t hmac_size = HMAC_size(hctx);
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE + hmac_size) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src.len -= hmac_size;
    uint8_t hmac[EVP_MAX_MD_SIZE];
    if (!HMAC_Update(hctx, src.base, src.len) || !HMAC_Final(hctx, hmac, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (!ptls_mem_equal(src.base + src.len, hmac, hmac_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }
    src.base += TICKET_LABEL_SIZE + TICKET_IV_SIZE;
    src.len -= TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* decrypt */
    if ((ret = ptls_buffer_reserve(buf, src.len)) != 0)
        goto Exit;
    if (!EVP_DecryptUpdate(cctx, buf->base + buf->off, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;
    if (!EVP_DecryptFinal_ex(cctx, buf->base + buf->off, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;

    ret = 0;

Exit:
    if (cctx != NULL)
        cleanup_cipher_ctx(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}